

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O0

void __thiscall
antlr::TokenStreamRecognitionException::TokenStreamRecognitionException
          (TokenStreamRecognitionException *this,RecognitionException *re)

{
  long *in_RSI;
  TokenStreamException *in_RDI;
  string *in_stack_ffffffffffffffa8;
  RecognitionException *pRVar1;
  RecognitionException *in_stack_ffffffffffffffc0;
  
  pRVar1 = (RecognitionException *)&stack0xffffffffffffffd0;
  (**(code **)(*in_RSI + 0x18))();
  TokenStreamException::TokenStreamException(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  (in_RDI->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamRecognitionException_00500408;
  RecognitionException::RecognitionException(in_stack_ffffffffffffffc0,pRVar1);
  return;
}

Assistant:

TokenStreamRecognitionException(RecognitionException& re)
	: TokenStreamException(re.getMessage())
	, recog(re)
	{
	}